

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

err_t btokSMRespUnwrap(apdu_resp_t *resp,size_t *size,octet *apdu,size_t count,void *state)

{
  bool_t bVar1;
  size_t sVar2;
  octet **val;
  size_t sVar3;
  ulong in_RCX;
  long in_RDX;
  size_t *in_RSI;
  undefined1 *in_RDI;
  octet *in_R8;
  btok_sm_st *st;
  octet *mac;
  octet *rdf;
  size_t rdf_len;
  size_t c2;
  size_t c1;
  undefined4 in_stack_ffffffffffffff98;
  u32 in_stack_ffffffffffffff9c;
  octet *in_stack_ffffffffffffffa0;
  apdu_resp_t *in_stack_ffffffffffffffa8;
  size_t *in_stack_ffffffffffffffb0;
  octet **in_stack_ffffffffffffffb8;
  octet *in_stack_ffffffffffffffc0;
  err_t local_4;
  
  if ((in_RCX < 2) || ((in_R8 != (octet *)0x0 && (in_RCX < 0xc)))) {
    local_4 = 0x138;
  }
  else if (in_R8 == (octet *)0x0) {
    sVar2 = apduRespDec(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (sVar2 == 0xffffffffffffffff) {
      local_4 = 0x138;
    }
    else {
      if (in_RSI != (size_t *)0x0) {
        *in_RSI = sVar2;
      }
      local_4 = 0;
    }
  }
  else {
    val = (octet **)
          derDec2(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                  &in_stack_ffffffffffffffa8->sw1,(size_t)in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff9c);
    if (val == (octet **)0xffffffffffffffff) {
      sVar2 = 0;
      val = (octet **)0x0;
    }
    else {
      if ((in_stack_ffffffffffffffb8 < (octet **)0x2) ||
         ((char)*in_stack_ffffffffffffffb0 != '\x02')) {
        return 0x138;
      }
      in_stack_ffffffffffffffb0 = (size_t *)((long)in_stack_ffffffffffffffb0 + 1);
      sVar2 = (long)in_stack_ffffffffffffffb8 - 1;
    }
    sVar3 = derDec3(val,in_stack_ffffffffffffffc0,sVar2,
                    (u32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                    (size_t)in_stack_ffffffffffffffa8);
    if ((sVar3 == 0xffffffffffffffff) || ((long)val + sVar3 + 2 != in_RCX)) {
      local_4 = 0x138;
    }
    else if (in_RDI == (undefined1 *)0x0) {
      if (in_RSI != (size_t *)0x0) {
        *in_RSI = sVar2 + 0x10;
      }
      local_4 = 0;
    }
    else if ((uint)in_R8[0x40] % 2 == 0) {
      beltMACStart(in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->sw1,(size_t)in_R8);
      beltMACStepA(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,in_R8);
      beltMACStepA(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,in_R8);
      beltMACStepA(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,in_R8);
      bVar1 = beltMACStepV(in_R8,(void *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98));
      if (bVar1 == 0) {
        local_4 = 0x1ff;
      }
      else {
        memSet(in_R8,(octet)(in_stack_ffffffffffffff9c >> 0x18),0x163886);
        *in_RDI = *(undefined1 *)(in_RDX + (in_RCX - 2));
        in_RDI[1] = *(undefined1 *)(in_RDX + (in_RCX - 1));
        *(size_t *)(in_RDI + 8) = sVar2;
        memCopy(in_R8,(void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x1638dd
               );
        if (sVar2 != 0) {
          beltCFBStart(in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->sw1,(size_t)in_R8,
                       (octet *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          beltCFBStepD(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,in_R8);
        }
        if (in_RSI != (size_t *)0x0) {
          *in_RSI = *(long *)(in_RDI + 8) + 0x10;
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 0x205;
    }
  }
  return local_4;
}

Assistant:

err_t btokSMRespUnwrap(apdu_resp_t* resp, size_t* size, const octet apdu[],
	size_t count, void* state)
{
	size_t c1, c2;
	size_t rdf_len;
	const octet* rdf;
	const octet* mac;
	btok_sm_st* st;
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(resp, sizeof(apdu_resp_t)));
	// слишком короткий ответ?
	if (count < 2 || state && count < 12)
		return ERR_BAD_APDU;
	// декодировать без снятия защиты?
	if (!state)
	{
		c1 = apduRespDec(resp, apdu, count);
		if (c1 == SIZE_MAX)
			return ERR_BAD_APDU;
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			ASSERT(resp == 0 ||
				memIsDisjoint2(size, O_PER_S, resp, apduRespSizeof(resp)));
			*size = c1;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), apdu, count));
	// разобрать защищенное поле rdf: шифртекст
	c1 = derDec2(&rdf, &rdf_len, apdu, count - 2, 0x87);
	if (c1 != SIZE_MAX)
	{
		if (rdf_len < 2 || rdf[0] != 0x02)
			return ERR_BAD_APDU;
		++rdf, --rdf_len;
	}
	else
		c1 = rdf_len = 0;
	// разобрать защищенное поле rdf: имитовставка
	c2 = derDec3(&mac, apdu + c1, count - 2 - c1, 0x8E, 8);
	if (c2 == SIZE_MAX || c1 + c2 + 2 != count)
		return ERR_BAD_APDU;
	// ограничиться проверкой формата?
	if (!resp)
	{
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			*size = sizeof(apdu_resp_t) + rdf_len;
		}
		return ERR_OK;
	}
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 0)
		return ERR_BAD_LOGIC;
	// проверить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, c1, st->stack);
	beltMACStepA(apdu + count - 2, 2, st->stack);
	if (!beltMACStepV(mac, st->stack))
		return ERR_BAD_MAC;
	// заполнить поля ответа
	memSetZero(resp, sizeof(apdu_resp_t));
	resp->sw1 = apdu[count - 2], resp->sw2 = apdu[count - 1];
	resp->rdf_len = rdf_len;
	memCopy(resp->rdf, rdf, rdf_len);
	ASSERT(memIsDisjoint2(resp, apduRespSizeof(resp), state, btokSM_keep()));
	ASSERT(memIsDisjoint2(resp, apduRespSizeof(resp), apdu, count));
	// расшифровать rdf
	if (rdf_len)
	{
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepD(resp->rdf, rdf_len, st->stack);
	}
	// возвратить размер
	if (size)
	{
		ASSERT(memIsDisjoint2(size, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
		ASSERT(memIsDisjoint2(size, O_PER_S, resp, apduRespSizeof(resp)));
		*size = apduRespSizeof(resp);
	}
	// завершить
	return ERR_OK;
}